

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  bool bVar2;
  entry_type eVar3;
  __type _Var4;
  uint32_t h;
  int32_t id;
  int32_t iVar5;
  Dictionary *this_00;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  uint32_t local_84;
  vector<int,_std::allocator<int>_> *local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> *local_58;
  undefined1 local_50 [32];
  
  local_50._0_8_ = local_50 + 0x10;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50[0x10] = 0;
  this_00 = this;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  iVar5 = 0;
  local_80 = words;
  local_58 = labels;
  do {
    bVar2 = readWord(this_00,in,(string *)local_50);
    if (!bVar2) break;
    h = hash(this_00,(string *)local_50);
    id = getId(this,(string *)local_50,h);
    if (id < 0) {
      eVar3 = getType(this,(string *)local_50);
    }
    else {
      eVar3 = getType(this,id);
    }
    if (eVar3 == word) {
      addSubwords(this,local_80,(string *)local_50,id);
      local_84 = h;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_78,(int *)&local_84);
    }
    else if (-1 < id && eVar3 == label) {
      local_84 = id - this->nwords_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_58,(int *)&local_84);
    }
    this_00 = (Dictionary *)local_50;
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)EOS_abi_cxx11_);
    iVar5 = iVar5 + 1;
  } while (!_Var4);
  addWordNgrams(this,local_80,(vector<int,_std::allocator<int>_> *)&local_78,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  std::__cxx11::string::~string((string *)local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  return iVar5;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}